

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O0

void helper_sve_trn_p_aarch64(void *vd,void *vn,void *vm,uint32_t pred_desc)

{
  byte bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint64_t mm;
  uint64_t nn;
  intptr_t i;
  int shl;
  int shr;
  uint64_t mask;
  uint64_t *m;
  uint64_t *n;
  uint64_t *d;
  _Bool odd;
  uintptr_t esz;
  intptr_t oprsz;
  uint32_t pred_desc_local;
  void *vm_local;
  void *vn_local;
  void *vd_local;
  
  uVar2 = extract32(pred_desc,0,5);
  uVar3 = extract32(pred_desc,10,2);
  uVar4 = extract32(pred_desc,0xc,1);
  bVar1 = (byte)(1 << ((byte)uVar3 & 0x1f));
  i._4_1_ = 0;
  _shl = even_bit_esz_masks[uVar3];
  i._0_1_ = bVar1;
  if (uVar4 != 0) {
    _shl = _shl << (bVar1 & 0x3f);
    i._0_1_ = 0;
    i._4_1_ = bVar1;
  }
  for (nn = 0; (long)nn < (long)(((ulong)(uVar2 + 2) + 7) / 8); nn = nn + 1) {
    *(ulong *)((long)vd + nn * 8) =
         ((*(ulong *)((long)vn + nn * 8) & _shl) >> (i._4_1_ & 0x3f)) +
         ((*(ulong *)((long)vm + nn * 8) & _shl) << ((byte)i & 0x3f));
  }
  return;
}

Assistant:

void HELPER(sve_trn_p)(void *vd, void *vn, void *vm, uint32_t pred_desc)
{
    intptr_t oprsz = extract32(pred_desc, 0, SIMD_OPRSZ_BITS) + 2;
    uintptr_t esz = extract32(pred_desc, SIMD_DATA_SHIFT, 2);
    bool odd = extract32(pred_desc, SIMD_DATA_SHIFT + 2, 1);
    uint64_t *d = vd, *n = vn, *m = vm;
    uint64_t mask;
    int shr, shl;
    intptr_t i;

    shl = 1 << esz;
    shr = 0;
    mask = even_bit_esz_masks[esz];
    if (odd) {
        mask <<= shl;
        shr = shl;
        shl = 0;
    }

    for (i = 0; i < DIV_ROUND_UP(oprsz, 8); i++) {
        uint64_t nn = (n[i] & mask) >> shr;
        uint64_t mm = (m[i] & mask) << shl;
        d[i] = nn + mm;
    }
}